

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

Vec_Ptr_t * Saig_ManBmcDfsNodes(Aig_Man_t *p,Vec_Ptr_t *vRoots)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Aig_Obj_t *pAVar2;
  undefined4 local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots_local;
  Aig_Man_t *p_local;
  
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_2c = 0; iVar1 = Vec_PtrSize(vRoots), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vRoots,local_2c);
    pAVar2 = Aig_ObjFanin0(pAVar2);
    Saig_ManBmcDfs_rec(p,pAVar2,vNodes_00);
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Saig_ManBmcDfsNodes( Aig_Man_t * p, Vec_Ptr_t * vRoots )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Saig_ManBmcDfs_rec( p, Aig_ObjFanin0(pObj), vNodes );
    return vNodes;
}